

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

void __thiscall EOPlus::Context::~Context(Context *this)

{
  this->_vptr_Context = (_func_int **)&PTR___cxa_pure_virtual_001bc580;
  std::__cxx11::string::~string((string *)&this->state_name);
  return;
}

Assistant:

Context::~Context()
	{

	}